

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::InterfacePortSymbol::serializeTo(InterfacePortSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  ASTSerializer *in_RSI;
  long in_RDI;
  ASTSerializer *in_stack_ffffffffffffff88;
  ASTSerializer *in_stack_ffffffffffffff90;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_20;
  undefined8 local_18;
  
  if (*(long *)(in_RDI + 0x40) != 0) {
    in_stack_ffffffffffffff90 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff88);
    ASTSerializer::write
              (in_stack_ffffffffffffff90,local_20,local_18,*(size_t *)(*(long *)(in_RDI + 0x40) + 8)
              );
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x48));
  if (!bVar1) {
    in_stack_ffffffffffffff88 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
               (char *)in_RSI);
    ASTSerializer::write(in_stack_ffffffffffffff88,local_40,local_38,*(size_t *)(in_RDI + 0x48));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
             (char *)in_stack_ffffffffffffff88);
  ASTSerializer::write(in_RSI,local_60,local_58,(ulong)(*(byte *)(in_RDI + 0x58) & 1));
  return;
}

Assistant:

void InterfacePortSymbol::serializeTo(ASTSerializer& serializer) const {
    if (interfaceDef)
        serializer.write("interfaceDef", interfaceDef->name);
    if (!modport.empty())
        serializer.write("modport", modport);
    serializer.write("isGeneric", isGeneric);
}